

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O3

void __thiscall LTAircraft::ToggleCameraView(LTAircraft *this)

{
  int iVar1;
  int i;
  long lVar2;
  int i_1;
  
  extOffs.heading = 0.0;
  extOffs.roll = 0.0;
  extOffs.zoom = 1.0;
  extOffs.x = 0.0;
  extOffs.y = 0.0;
  extOffs.z = 0.0;
  extOffs.pitch = -5.0;
  if (pExtViewAc == (LTAircraft *)0x0) {
    pExtViewAc = this;
    if (dataRefs.bUseExternalCamera == 0) {
      CalcCameraViewPos(this);
      iVar1 = XPLMGetDatai(dataRefs.adrXP[6]);
      if (iVar1 == 0) {
        prevView = XPLMGetDatai(dataRefs.adrXP[7]);
        DataRefs::SetViewType(&dataRefs,VIEW_FREE_CAM);
      }
      else {
        prevView = VIEW_UNKNOWN;
      }
      lVar2 = 0;
      XPLMControlCamera(1,CameraCB,0);
      do {
        if (dataRefs.cmdXP[lVar2] != (XPLMCommandRef)0x0) {
          XPLMRegisterCommandHandler(dataRefs.cmdXP[lVar2],CameraCommandsCB,0,lVar2);
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x20);
    }
  }
  else if (pExtViewAc == this) {
    pExtViewAc = (LTAircraft *)0x0;
    if (dataRefs.bUseExternalCamera == 0) {
      lVar2 = 0;
      do {
        if (dataRefs.cmdXP[lVar2] != (XPLMCommandRef)0x0) {
          XPLMUnregisterCommandHandler(dataRefs.cmdXP[lVar2],CameraCommandsCB,0,lVar2);
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x20);
      XPLMDontControlCamera();
      if (prevView != VIEW_UNKNOWN) {
        DataRefs::SetViewType(&dataRefs,prevView);
        prevView = VIEW_UNKNOWN;
      }
    }
  }
  else {
    pExtViewAc = this;
    CalcCameraViewPos(this);
  }
  DataRefs::SetCameraAc(&dataRefs,pExtViewAc);
  return;
}

Assistant:

void LTAircraft::ToggleCameraView()
{
    // reset camera offset
    extOffs.x = extOffs.y = extOffs.z = extOffs.heading = extOffs.roll = 0.0f;
    extOffs.zoom = 1.0f;
    extOffs.pitch = MDL_EXT_CAMERA_PITCH;

    // starting a new external view?
    if (!pExtViewAc) {
        pExtViewAc = this;                          // remember ourself as the aircraft to show
        if (!dataRefs.ShallUseExternalCamera()) {
            CalcCameraViewPos();                    // calc first position

            // we shall ensure to set an external view first,
            // so that sound and 2D stuff is handled correctly
            if (!dataRefs.IsViewExternal()) {
                prevView = dataRefs.GetViewType();
                dataRefs.SetViewType(VIEW_FREE_CAM);
            }
            else
                prevView = VIEW_UNKNOWN;

            XPLMControlCamera(xplm_ControlCameraUntilViewChanges, CameraCB, nullptr);
            CameraRegisterCommands(true);
        }
    }
    else if (pExtViewAc == this) {      // me again? -> switch off
        pExtViewAc = nullptr;
        if (!dataRefs.ShallUseExternalCamera()) {
            CameraRegisterCommands(false);
            XPLMDontControlCamera();

            // if a previous view is known we make sure we go back there
            if (prevView) {
                dataRefs.SetViewType(prevView);
                prevView = VIEW_UNKNOWN;
            }
        }
    }
    else {                              // view another plane
        pExtViewAc = this;
        CalcCameraViewPos();
    }
    
    // Inform 3rd party camera plugins
    dataRefs.SetCameraAc(pExtViewAc);
}